

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse2_128_8.c
# Opt level: O0

parasail_result_t *
parasail_sw_diag_sse2_128_8
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int *piVar23;
  int *piVar24;
  int *piVar25;
  int *piVar26;
  int *piVar27;
  int *piVar28;
  int *piVar29;
  int *piVar30;
  int *piVar31;
  int *piVar32;
  int *piVar33;
  int *piVar34;
  int *piVar35;
  int *piVar36;
  int *piVar37;
  int *piVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  longlong lVar58;
  undefined5 uVar59;
  undefined5 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  char cVar68;
  char cVar69;
  int8_t iVar70;
  int8_t *ptr;
  int8_t *ptr_00;
  int8_t *ptr_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined4 in_register_00000084;
  longlong lVar71;
  undefined4 in_register_0000008c;
  longlong lVar72;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  longlong extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  longlong extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qa_08;
  longlong extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar73 [16];
  longlong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  longlong extraout_XMM0_Qb_05;
  longlong extraout_XMM0_Qb_06;
  longlong extraout_XMM0_Qb_07;
  longlong extraout_XMM0_Qb_08;
  ulong uVar74;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i a_16;
  __m128i alVar75;
  __m128i alVar76;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i b_16;
  __m128i mask;
  __m128i mask_00;
  __m128i mask_01;
  __m128i mask_02;
  __m128i mask_03;
  __m128i mask_04;
  __m128i mask_05;
  __m128i mask_06;
  __m128i mask_07;
  __m128i mask_08;
  __m128i mask_09;
  uint local_d88;
  uint local_d84;
  int local_d70;
  int local_d6c;
  int local_d58;
  int local_d54;
  int local_d40;
  int local_d3c;
  int local_d28;
  int local_d24;
  int local_d10;
  int local_d0c;
  int local_cf8;
  int local_cf4;
  int local_ce0;
  int local_cdc;
  int local_cc8;
  int local_cc4;
  int local_cb0;
  int local_cac;
  int local_c98;
  int local_c94;
  int local_c80;
  int local_c7c;
  int local_c68;
  int local_c64;
  int local_c50;
  int local_c4c;
  int local_c38;
  int local_c34;
  int local_c20;
  int local_c1c;
  int local_bf8;
  int local_bf4;
  longlong *plStack_bf0;
  int32_t k;
  int16_t *jhi;
  int16_t *ihi;
  int16_t *jlo;
  int16_t *ilo;
  int8_t *t;
  __m128i cond_hi;
  __m128i cond_lo;
  __m128i cond_Jlt;
  __m128i cond_all;
  __m128i cond_max;
  __m128i cond_eq;
  __m128i cond_valid_IJ;
  __m128i cond_valid_J;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  __m128i vIltLimit;
  int *matrow15;
  int *matrow14;
  int *matrow13;
  int *matrow12;
  int *matrow11;
  int *matrow10;
  int *matrow9;
  int *matrow8;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vJHi16;
  __m128i vJLo16;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vJLimit16;
  __m128i vILimit16;
  __m128i vEndJHi;
  __m128i vEndJLo;
  __m128i vEndIHi;
  __m128i vEndILo;
  __m128i vMaxH;
  __m128i vJresetHi16;
  __m128i vJresetLo16;
  __m128i vIHi16;
  __m128i vILo16;
  __m128i vN16;
  __m128i vNegOne16;
  __m128i vOne16;
  __m128i vZero;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf0;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int local_8b0;
  int8_t score;
  int8_t POS_LIMIT;
  int iStack_8ac;
  int8_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int8_t *F_pr;
  int8_t *H_pr;
  int8_t *s2;
  int8_t *_F_pr;
  int8_t *_H_pr;
  int8_t *s2B;
  int8_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  short local_3f8;
  short sStack_3f6;
  short sStack_3f4;
  short sStack_3f2;
  short sStack_3f0;
  short sStack_3ee;
  short sStack_3ec;
  short sStack_3ea;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  uint local_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  uint local_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  short local_308;
  short sStack_306;
  short sStack_304;
  short sStack_302;
  short sStack_300;
  short sStack_2fe;
  short sStack_2fc;
  short sStack_2fa;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  short sStack_2e0;
  short sStack_2de;
  short sStack_2dc;
  short sStack_2da;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_26a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  char local_1d8;
  char cStack_1d7;
  char cStack_1d6;
  char cStack_1d5;
  char cStack_1d4;
  char cStack_1d3;
  char cStack_1d2;
  char cStack_1d1;
  char cStack_1d0;
  char cStack_1cf;
  char cStack_1ce;
  char cStack_1cd;
  char cStack_1cc;
  char cStack_1cb;
  char cStack_1ca;
  char cStack_1c9;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  
  lVar72 = CONCAT44(in_register_0000008c,gap);
  lVar71 = CONCAT44(in_register_00000084,open);
  s2B = (int8_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_diag_sse2_128_8","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_diag_sse2_128_8","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_diag_sse2_128_8","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_diag_sse2_128_8","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_diag_sse2_128_8","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_diag_sse2_128_8","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_diag_sse2_128_8","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_bf8 = _s1Len;
    if (matrix->type != 0) {
      local_bf8 = matrix->length;
    }
    iStack_8ac = 0;
    local_8b0 = 0;
    N._0_1_ = (char)open;
    cVar68 = (char)N;
    if (matrix->min <= -open) {
      cVar68 = -(char)matrix->min;
    }
    cVar68 = cVar68 + -0x7f;
    cVar69 = ((byte)matrix->max ^ 0x7f) - 1;
    vNegInf[1] = CONCAT17(cVar68,CONCAT16(cVar68,CONCAT15(cVar68,CONCAT14(cVar68,CONCAT13(cVar68,
                                                  CONCAT12(cVar68,CONCAT11(cVar68,cVar68)))))));
    vSaturationCheckMax[0] =
         CONCAT17(cVar68,CONCAT16(cVar68,CONCAT15(cVar68,CONCAT14(cVar68,CONCAT13(cVar68,CONCAT12(
                                                  cVar68,CONCAT11(cVar68,cVar68)))))));
    vSaturationCheckMax[1] =
         CONCAT17(cVar69,CONCAT16(cVar69,CONCAT15(cVar69,CONCAT14(cVar69,CONCAT13(cVar69,CONCAT12(
                                                  cVar69,CONCAT11(cVar69,cVar69)))))));
    vSaturationCheckMin[0] =
         CONCAT17(cVar69,CONCAT16(cVar69,CONCAT15(cVar69,CONCAT14(cVar69,CONCAT13(cVar69,CONCAT12(
                                                  cVar69,CONCAT11(cVar69,cVar69)))))));
    uVar59 = CONCAT14(cVar68,CONCAT13(cVar68,CONCAT12(cVar68,CONCAT11(cVar68,cVar68))));
    lVar58 = CONCAT17(cVar68,CONCAT16(cVar68,CONCAT15(cVar68,uVar59)));
    uVar60 = CONCAT14(cVar68,CONCAT13(cVar68,CONCAT12(cVar68,CONCAT11(cVar68,cVar68))));
    uVar74 = CONCAT17(cVar68,CONCAT16(cVar68,CONCAT15(cVar68,uVar60)));
    auVar40._8_8_ = uVar74;
    auVar40._0_8_ = lVar58;
    uVar61 = CONCAT17((char)N,CONCAT16((char)N,CONCAT15((char)N,CONCAT14((char)N,CONCAT13((char)N,
                                                  CONCAT12((char)N,CONCAT11((char)N,(char)N)))))));
    uVar62 = CONCAT17((char)N,CONCAT16((char)N,CONCAT15((char)N,CONCAT14((char)N,CONCAT13((char)N,
                                                  CONCAT12((char)N,CONCAT11((char)N,(char)N)))))));
    PAD._0_1_ = (undefined1)gap;
    uVar63 = CONCAT17((undefined1)PAD,
                      CONCAT16((undefined1)PAD,
                               CONCAT15((undefined1)PAD,
                                        CONCAT14((undefined1)PAD,
                                                 CONCAT13((undefined1)PAD,
                                                          CONCAT12((undefined1)PAD,
                                                                   CONCAT11((undefined1)PAD,
                                                                            (undefined1)PAD)))))));
    uVar64 = CONCAT17((undefined1)PAD,
                      CONCAT16((undefined1)PAD,
                               CONCAT15((undefined1)PAD,
                                        CONCAT14((undefined1)PAD,
                                                 CONCAT13((undefined1)PAD,
                                                          CONCAT12((undefined1)PAD,
                                                                   CONCAT11((undefined1)PAD,
                                                                            (undefined1)PAD)))))));
    vIHi16[1] = 0xc000d000e000f;
    vILo16[0] = 0x80009000a000b;
    vJresetLo16[1] = 0x4000500060007;
    vIHi16[0] = 0x100020003;
    s2Len_PAD._0_2_ = (short)local_bf8;
    vILimit16[0] = CONCAT26((short)s2Len_PAD,
                            CONCAT24((short)s2Len_PAD,CONCAT22((short)s2Len_PAD,(short)s2Len_PAD)));
    gap_local._0_2_ = (short)s2Len;
    vILimit16[1] = lVar58;
    vEndJHi[0] = uVar74;
    vEndJHi[1] = lVar58;
    vEndJLo[0] = uVar74;
    vEndJLo[1] = lVar58;
    vEndIHi[0] = uVar74;
    vEndIHi[1] = lVar58;
    vEndILo[0] = uVar74;
    vEndILo[1] = lVar58;
    _s1_local = (char *)parasail_result_new();
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x10101004;
      ptr = parasail_memalign_int8_t(0x10,(long)(s2Len + 0x1e));
      ptr_00 = parasail_memalign_int8_t(0x10,(long)(s2Len + 0x1e));
      ptr_01 = parasail_memalign_int8_t(0x10,(long)(s2Len + 0x1e));
      if (ptr == (int8_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int8_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int8_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          s2B = parasail_memalign_int8_t(0x10,(long)(local_bf8 + 0xf));
          if (s2B == (int8_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (end_query = 0; end_query < local_bf8; end_query = end_query + 1) {
            s2B[end_query] = (int8_t)matrix->mapper[(byte)_s1[end_query]];
          }
          for (end_query = local_bf8; end_query < local_bf8 + 0xf; end_query = end_query + 1) {
            s2B[end_query] = '\0';
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 0xf] = (int8_t)matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -0xf; iVar7 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 0xf] = '\0';
        }
        while (end_ref = iVar7, end_ref < s2Len + 0xf) {
          ptr[(long)end_ref + 0xf] = '\0';
          iVar7 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 0xf] = '\0';
          ptr_01[(long)end_ref + 0xf] = cVar68;
        }
        for (end_ref = -0xf; iVar7 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 0xf] = cVar68;
          ptr_01[(long)end_ref + 0xf] = cVar68;
        }
        while (end_ref = iVar7, end_ref < s2Len + 0xf) {
          ptr_00[(long)end_ref + 0xf] = cVar68;
          ptr_01[(long)end_ref + 0xf] = cVar68;
          iVar7 = end_ref + 1;
        }
        for (end_query = 0; end_query < local_bf8; end_query = end_query + 0x10) {
          vOpen[1] = auVar40._1_8_;
          vNegInf0[0] = uVar74 >> 8;
          vNH[0] = vNegInf0[0];
          vWH[1] = vOpen[1];
          vE[1]._0_4_ = (uint)((uint5)uVar59 >> 8);
          vE[1]._4_4_ = auVar40._5_4_;
          vWH[0]._0_4_ = (uint)((uint5)uVar60 >> 8);
          vWH[0]._4_4_ = (uint)(uVar74 >> 0x28);
          piVar23 = matrix->matrix;
          iVar7 = matrix->size;
          if (matrix->type == 0) {
            local_c1c = (int)s2B[end_query];
          }
          else {
            if (end_query < local_bf8) {
              local_c20 = end_query;
            }
            else {
              local_c20 = local_bf8 + -1;
            }
            local_c1c = local_c20;
          }
          piVar24 = matrix->matrix;
          iVar8 = matrix->size;
          if (matrix->type == 0) {
            local_c34 = (int)s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_bf8) {
              local_c38 = end_query + 1;
            }
            else {
              local_c38 = local_bf8 + -1;
            }
            local_c34 = local_c38;
          }
          piVar25 = matrix->matrix;
          iVar9 = matrix->size;
          if (matrix->type == 0) {
            local_c4c = (int)s2B[end_query + 2];
          }
          else {
            if (end_query + 2 < local_bf8) {
              local_c50 = end_query + 2;
            }
            else {
              local_c50 = local_bf8 + -1;
            }
            local_c4c = local_c50;
          }
          piVar26 = matrix->matrix;
          iVar10 = matrix->size;
          if (matrix->type == 0) {
            local_c64 = (int)s2B[end_query + 3];
          }
          else {
            if (end_query + 3 < local_bf8) {
              local_c68 = end_query + 3;
            }
            else {
              local_c68 = local_bf8 + -1;
            }
            local_c64 = local_c68;
          }
          piVar27 = matrix->matrix;
          iVar11 = matrix->size;
          if (matrix->type == 0) {
            local_c7c = (int)s2B[end_query + 4];
          }
          else {
            if (end_query + 4 < local_bf8) {
              local_c80 = end_query + 4;
            }
            else {
              local_c80 = local_bf8 + -1;
            }
            local_c7c = local_c80;
          }
          piVar28 = matrix->matrix;
          iVar12 = matrix->size;
          if (matrix->type == 0) {
            local_c94 = (int)s2B[end_query + 5];
          }
          else {
            if (end_query + 5 < local_bf8) {
              local_c98 = end_query + 5;
            }
            else {
              local_c98 = local_bf8 + -1;
            }
            local_c94 = local_c98;
          }
          piVar29 = matrix->matrix;
          iVar13 = matrix->size;
          if (matrix->type == 0) {
            local_cac = (int)s2B[end_query + 6];
          }
          else {
            if (end_query + 6 < local_bf8) {
              local_cb0 = end_query + 6;
            }
            else {
              local_cb0 = local_bf8 + -1;
            }
            local_cac = local_cb0;
          }
          piVar30 = matrix->matrix;
          iVar14 = matrix->size;
          if (matrix->type == 0) {
            local_cc4 = (int)s2B[end_query + 7];
          }
          else {
            if (end_query + 7 < local_bf8) {
              local_cc8 = end_query + 7;
            }
            else {
              local_cc8 = local_bf8 + -1;
            }
            local_cc4 = local_cc8;
          }
          piVar31 = matrix->matrix;
          iVar15 = matrix->size;
          if (matrix->type == 0) {
            local_cdc = (int)s2B[end_query + 8];
          }
          else {
            if (end_query + 8 < local_bf8) {
              local_ce0 = end_query + 8;
            }
            else {
              local_ce0 = local_bf8 + -1;
            }
            local_cdc = local_ce0;
          }
          piVar32 = matrix->matrix;
          iVar16 = matrix->size;
          if (matrix->type == 0) {
            local_cf4 = (int)s2B[end_query + 9];
          }
          else {
            if (end_query + 9 < local_bf8) {
              local_cf8 = end_query + 9;
            }
            else {
              local_cf8 = local_bf8 + -1;
            }
            local_cf4 = local_cf8;
          }
          piVar33 = matrix->matrix;
          iVar17 = matrix->size;
          if (matrix->type == 0) {
            local_d0c = (int)s2B[end_query + 10];
          }
          else {
            if (end_query + 10 < local_bf8) {
              local_d10 = end_query + 10;
            }
            else {
              local_d10 = local_bf8 + -1;
            }
            local_d0c = local_d10;
          }
          piVar34 = matrix->matrix;
          iVar18 = matrix->size;
          if (matrix->type == 0) {
            local_d24 = (int)s2B[end_query + 0xb];
          }
          else {
            if (end_query + 0xb < local_bf8) {
              local_d28 = end_query + 0xb;
            }
            else {
              local_d28 = local_bf8 + -1;
            }
            local_d24 = local_d28;
          }
          piVar35 = matrix->matrix;
          iVar19 = matrix->size;
          if (matrix->type == 0) {
            local_d3c = (int)s2B[end_query + 0xc];
          }
          else {
            if (end_query + 0xc < local_bf8) {
              local_d40 = end_query + 0xc;
            }
            else {
              local_d40 = local_bf8 + -1;
            }
            local_d3c = local_d40;
          }
          piVar36 = matrix->matrix;
          iVar20 = matrix->size;
          if (matrix->type == 0) {
            local_d54 = (int)s2B[end_query + 0xd];
          }
          else {
            if (end_query + 0xd < local_bf8) {
              local_d58 = end_query + 0xd;
            }
            else {
              local_d58 = local_bf8 + -1;
            }
            local_d54 = local_d58;
          }
          piVar37 = matrix->matrix;
          iVar21 = matrix->size;
          if (matrix->type == 0) {
            local_d6c = (int)s2B[end_query + 0xe];
          }
          else {
            if (end_query + 0xe < local_bf8) {
              local_d70 = end_query + 0xe;
            }
            else {
              local_d70 = local_bf8 + -1;
            }
            local_d6c = local_d70;
          }
          piVar38 = matrix->matrix;
          iVar22 = matrix->size;
          if (matrix->type == 0) {
            local_d84 = (uint)s2B[end_query + 0xf];
          }
          else {
            if (end_query + 0xf < local_bf8) {
              local_d88 = end_query + 0xf;
            }
            else {
              local_d88 = local_bf8 - 1;
            }
            local_d84 = local_d88;
          }
          alVar75[1] = (ulong)local_d84;
          sStack_2f0 = (short)vILimit16[0];
          sStack_2ee = (short)((ulong)vILimit16[0] >> 0x10);
          sStack_2ec = (short)((ulong)vILimit16[0] >> 0x20);
          sStack_2ea = (short)((ulong)vILimit16[0] >> 0x30);
          local_308 = (short)vIHi16[1];
          sStack_306 = (short)((ulong)vIHi16[1] >> 0x10);
          sStack_304 = (short)((ulong)vIHi16[1] >> 0x20);
          sStack_302 = (short)((ulong)vIHi16[1] >> 0x30);
          sStack_300 = (short)vILo16[0];
          sStack_2fe = (short)((ulong)vILo16[0] >> 0x10);
          sStack_2fc = (short)((ulong)vILo16[0] >> 0x20);
          sStack_2fa = (short)((ulong)vILo16[0] >> 0x30);
          local_2e8 = (short)vJresetLo16[1];
          sStack_2e6 = (short)((ulong)vJresetLo16[1] >> 0x10);
          sStack_2e4 = (short)((ulong)vJresetLo16[1] >> 0x20);
          sStack_2e2 = (short)((ulong)vJresetLo16[1] >> 0x30);
          sStack_2e0 = (short)vIHi16[0];
          sStack_2de = (short)((ulong)vIHi16[0] >> 0x10);
          sStack_2dc = (short)((ulong)vIHi16[0] >> 0x20);
          sStack_2da = (short)((ulong)vIHi16[0] >> 0x30);
          auVar49._2_2_ = -(ushort)(sStack_306 < (short)s2Len_PAD);
          auVar49._0_2_ = -(ushort)(local_308 < (short)s2Len_PAD);
          auVar49._4_2_ = -(ushort)(sStack_304 < (short)s2Len_PAD);
          auVar49._6_2_ = -(ushort)(sStack_302 < (short)s2Len_PAD);
          auVar49._8_2_ = -(ushort)(sStack_300 < sStack_2f0);
          auVar49._10_2_ = -(ushort)(sStack_2fe < sStack_2ee);
          auVar49._12_2_ = -(ushort)(sStack_2fc < sStack_2ec);
          auVar49._14_2_ = -(ushort)(sStack_2fa < sStack_2ea);
          auVar73._2_2_ = -(ushort)(sStack_2e6 < (short)s2Len_PAD);
          auVar73._0_2_ = -(ushort)(local_2e8 < (short)s2Len_PAD);
          auVar73._4_2_ = -(ushort)(sStack_2e4 < (short)s2Len_PAD);
          auVar73._6_2_ = -(ushort)(sStack_2e2 < (short)s2Len_PAD);
          auVar73._8_2_ = -(ushort)(sStack_2e0 < sStack_2f0);
          auVar73._10_2_ = -(ushort)(sStack_2de < sStack_2ee);
          auVar73._12_2_ = -(ushort)(sStack_2dc < sStack_2ec);
          auVar73._14_2_ = -(ushort)(sStack_2da < sStack_2ea);
          packsswb(auVar49,auVar73);
          matrow0 = (int *)0xfffcfffbfffafff9;
          vJHi16[0] = 0xfffffffefffd;
          vJHi16[1] = -0xb000c000d000f;
          vJLo16[0] = -0x700080009000b;
          vF[1] = lVar58;
          vE[0] = uVar74;
          for (end_ref = 0; auVar73 = stack0xfffffffffffff5c8, end_ref < s2Len + 0xf;
              end_ref = end_ref + 1) {
            alVar76[0] = (ulong)(uint)(int)ptr_00[(long)end_ref + 0xf];
            alVar76[1] = 0xf;
            alVar75 = _mm_insert_epi8_rpl(alVar76,(int8_t)alVar75[1],end_ref);
            vNH[0] = extraout_XMM0_Qb;
            vWH[1] = extraout_XMM0_Qa;
            b_08[1] = (long)end_ref;
            a[0] = (ulong)(uint)(int)ptr_01[b_08[1] + 0xf];
            a[1]._0_4_ = 0xf;
            a[1]._4_4_ = 0;
            b_01[1] = 0xf;
            alVar75 = _mm_insert_epi8_rpl(a,(int8_t)alVar75[1],end_ref);
            b[0] = alVar75[1];
            auVar57._8_8_ = extraout_XMM0_Qb;
            auVar57._0_8_ = extraout_XMM0_Qa;
            auVar56._8_8_ = uVar62;
            auVar56._0_8_ = uVar61;
            psubsb(auVar57,auVar56);
            auVar55._8_8_ = extraout_XMM0_Qb_00;
            auVar55._0_8_ = extraout_XMM0_Qa_00;
            auVar54._8_8_ = uVar64;
            auVar54._0_8_ = uVar63;
            psubsb(auVar55,auVar54);
            a_00[1] = b_01[1];
            a_00[0] = a[0];
            b[1] = b_08[1];
            alVar75 = _mm_max_epi8_rpl(a_00,b);
            b_00[0] = alVar75[1];
            auVar53._4_4_ = vE[1]._4_4_;
            auVar53._0_4_ = (uint)vE[1];
            auVar53._12_4_ = vWH[0]._4_4_;
            auVar53._8_4_ = (uint)vWH[0];
            auVar52._8_8_ = uVar62;
            auVar52._0_8_ = uVar61;
            psubsb(auVar53,auVar52);
            auVar51._8_8_ = vE[0];
            auVar51._0_8_ = vF[1];
            auVar50._8_8_ = uVar64;
            auVar50._0_8_ = uVar63;
            psubsb(auVar51,auVar50);
            a_01[1] = b_01[1];
            a_01[0] = a[0];
            b_00[1] = b_08[1];
            _mm_max_epi8_rpl(a_01,b_00);
            uVar1 = (undefined1)
                    piVar32[(long)(iVar16 * local_cf4) + (long)ptr[(long)(end_ref + -9) + 0xf]];
            lVar72 = CONCAT71((int7)((ulong)lVar72 >> 8),uVar1);
            uVar2 = (undefined1)
                    piVar33[(long)(iVar17 * local_d0c) + (long)ptr[(long)(end_ref + -10) + 0xf]];
            lVar71 = CONCAT71((int7)((ulong)lVar71 >> 8),uVar2);
            uVar3 = (undefined1)
                    piVar34[(long)(iVar18 * local_d24) + (long)ptr[(long)(end_ref + -0xb) + 0xf]];
            alVar75[0] = CONCAT71((int7)(a[0] >> 8),uVar3);
            uVar4 = (undefined1)
                    piVar35[(long)(iVar19 * local_d3c) + (long)ptr[(long)(end_ref + -0xc) + 0xf]];
            alVar75[1] = CONCAT71(ptr[(long)(end_ref + -0xc) + 0xf] >> 7,uVar4);
            uVar5 = (undefined1)
                    piVar36[(long)(iVar20 * local_d54) + (long)ptr[(long)(end_ref + -0xd) + 0xf]];
            b_01[0]._1_7_ = (int7)(ptr[(long)(end_ref + -0xd) + 0xf] >> 7);
            b_01[0]._0_1_ = uVar5;
            uVar6 = (undefined1)
                    piVar37[(long)(iVar21 * local_d6c) + (long)ptr[(long)(end_ref + -0xe) + 0xf]];
            b_01[1] = CONCAT71(ptr[(long)(end_ref + -0xf) + 0xf] >> 7,uVar6);
            auVar65[1] = uVar6;
            auVar65[0] = (char)piVar38[(long)(int)(iVar22 * local_d84) +
                                       (long)ptr[(long)(end_ref + -0xf) + 0xf]];
            auVar65[2] = uVar5;
            auVar65[3] = uVar4;
            auVar65[4] = uVar3;
            auVar65[5] = uVar2;
            auVar65[6] = uVar1;
            auVar65[7] = (char)piVar31[(long)(iVar15 * local_cdc) +
                                       (long)ptr[(long)(end_ref + -8) + 0xf]];
            auVar65[9] = (char)piVar29[(long)(iVar13 * local_cac) +
                                       (long)ptr[(long)(end_ref + -6) + 0xf]];
            auVar65[8] = (char)piVar30[(long)(iVar14 * local_cc4) +
                                       (long)ptr[(long)(end_ref + -7) + 0xf]];
            auVar65[10] = (char)piVar28[(long)(iVar12 * local_c94) +
                                        (long)ptr[(long)(end_ref + -5) + 0xf]];
            auVar65[0xb] = (char)piVar27[(long)(iVar11 * local_c7c) +
                                         (long)ptr[(long)(end_ref + -4) + 0xf]];
            auVar65[0xc] = (char)piVar26[(long)(iVar10 * local_c64) +
                                         (long)ptr[(long)(end_ref + -3) + 0xf]];
            auVar65[0xd] = (char)piVar25[(long)(iVar9 * local_c4c) +
                                         (long)ptr[(long)(end_ref + -2) + 0xf]];
            auVar65[0xe] = (char)piVar24[(long)(iVar8 * local_c34) +
                                         (long)ptr[(long)(end_ref + -1) + 0xf]];
            auVar65[0xf] = (char)piVar23[(long)(iVar7 * local_c1c) + (long)ptr[(long)end_ref + 0xf]]
            ;
            paddsb(auVar73,auVar65);
            alVar76 = _mm_max_epi8_rpl(alVar75,b_01);
            b_02[0] = alVar76[1];
            a_02[1] = alVar75[1];
            a_02[0] = alVar75[0];
            b_02[1] = b_01[1];
            alVar76 = _mm_max_epi8_rpl(a_02,b_02);
            b_03[0] = alVar76[1];
            a_03[1] = alVar75[1];
            a_03[0] = alVar75[0];
            b_03[1] = b_01[1];
            alVar76 = _mm_max_epi8_rpl(a_03,b_03);
            b_04[0] = alVar76[1];
            local_3d8 = (short)vJHi16[1];
            sStack_3d6 = (short)((ulong)vJHi16[1] >> 0x10);
            sStack_3d4 = (short)((ulong)vJHi16[1] >> 0x20);
            sStack_3d2 = (short)((ulong)vJHi16[1] >> 0x30);
            sStack_3d0 = (short)vJLo16[0];
            sStack_3ce = (short)((ulong)vJLo16[0] >> 0x10);
            sStack_3cc = (short)((ulong)vJLo16[0] >> 0x20);
            sStack_3ca = (short)((ulong)vJLo16[0] >> 0x30);
            local_3f8 = (short)matrow0;
            sStack_3f6 = (short)((ulong)matrow0 >> 0x10);
            sStack_3f4 = (short)((ulong)matrow0 >> 0x20);
            sStack_3f2 = (short)((ulong)matrow0 >> 0x30);
            sStack_3f0 = (short)vJHi16[0];
            sStack_3ee = (short)((ulong)vJHi16[0] >> 0x10);
            sStack_3ec = (short)((ulong)vJHi16[0] >> 0x20);
            sStack_3ea = (short)((ulong)vJHi16[0] >> 0x30);
            auVar48._2_2_ = -(ushort)(sStack_3d6 == -1);
            auVar48._0_2_ = -(ushort)(local_3d8 == -1);
            auVar48._4_2_ = -(ushort)(sStack_3d4 == -1);
            auVar48._6_2_ = -(ushort)(sStack_3d2 == -1);
            auVar48._8_2_ = -(ushort)(sStack_3d0 == -1);
            auVar48._10_2_ = -(ushort)(sStack_3ce == -1);
            auVar48._12_2_ = -(ushort)(sStack_3cc == -1);
            auVar48._14_2_ = -(ushort)(sStack_3ca == -1);
            auVar47._2_2_ = -(ushort)(sStack_3f6 == -1);
            auVar47._0_2_ = -(ushort)(local_3f8 == -1);
            auVar47._4_2_ = -(ushort)(sStack_3f4 == -1);
            auVar47._6_2_ = -(ushort)(sStack_3f2 == -1);
            auVar47._8_2_ = -(ushort)(sStack_3f0 == -1);
            auVar47._10_2_ = -(ushort)(sStack_3ee == -1);
            auVar47._12_2_ = -(ushort)(sStack_3ec == -1);
            auVar47._14_2_ = -(ushort)(sStack_3ea == -1);
            auVar73 = packsswb(auVar48,auVar47);
            local_3b8 = auVar73._0_4_;
            uStack_3b4 = auVar73._4_4_;
            uStack_3b0 = auVar73._8_4_;
            uStack_3ac = auVar73._12_4_;
            local_3c8 = (uint)extraout_XMM0_Qa_01;
            uStack_3c4 = (uint)((ulong)extraout_XMM0_Qa_01 >> 0x20);
            uStack_3c0 = (uint)extraout_XMM0_Qb_01;
            uStack_3bc = (uint)((ulong)extraout_XMM0_Qb_01 >> 0x20);
            vE[1]._0_4_ = (local_3b8 ^ 0xffffffff) & local_3c8;
            vE[1]._4_4_ = (uStack_3b4 ^ 0xffffffff) & uStack_3c4;
            vWH[0]._0_4_ = (uStack_3b0 ^ 0xffffffff) & uStack_3c0;
            vWH[0]._4_4_ = (uStack_3ac ^ 0xffffffff) & uStack_3bc;
            a_04[1] = alVar75[1];
            a_04[0] = alVar75[0];
            b_04[1] = b_01[1];
            mask[1] = lVar72;
            mask[0] = lVar71;
            alVar76 = _mm_blendv_epi8_rpl(a_04,b_04,mask);
            b_05[0] = alVar76[1];
            a_05[1] = alVar75[1];
            a_05[0] = alVar75[0];
            b_05[1] = b_01[1];
            mask_00[1] = lVar72;
            mask_00[0] = lVar71;
            alVar76 = _mm_blendv_epi8_rpl(a_05,b_05,mask_00);
            b_06[0] = alVar76[1];
            if (0xf < end_ref) {
              a_06[1] = alVar75[1];
              a_06[0] = alVar75[0];
              b_06[1] = b_01[1];
              alVar76 = _mm_min_epi8_rpl(a_06,b_06);
              b_07[0] = alVar76[1];
              a_07[1] = alVar75[1];
              a_07[0] = alVar75[0];
              b_07[1] = b_01[1];
              alVar76 = _mm_max_epi8_rpl(a_07,b_07);
              b_06[0] = alVar76[1];
              vNegInf[1] = extraout_XMM0_Qa_04;
              vSaturationCheckMax[0] = extraout_XMM0_Qb_04;
              vSaturationCheckMax[1] = extraout_XMM0_Qa_03;
              vSaturationCheckMin[0] = extraout_XMM0_Qb_03;
            }
            auVar39._8_8_ = 0;
            auVar39._0_8_ = alVar75[1];
            iVar70 = _mm_extract_epi8_rpl((__m128i)(auVar39 << 0x40),(int)b_06[0]);
            b_01[1] = 0;
            ptr_00[(long)(end_ref + -0xf) + 0xf] = iVar70;
            auVar67._8_8_ = 0;
            auVar67._0_8_ = alVar75[1];
            iVar70 = _mm_extract_epi8_rpl
                               ((__m128i)(auVar67 << 0x40),
                                (int)CONCAT71((int7)((ulong)extraout_RDX >> 8),iVar70));
            b_08[0]._1_7_ = (undefined7)((ulong)extraout_RDX_00 >> 8);
            b_08[0]._0_1_ = iVar70;
            b_08[1] = (long)(end_ref + -0xf);
            ptr_01[b_08[1] + 0xf] = iVar70;
            auVar46._2_2_ = -(ushort)(-1 < sStack_3d6);
            auVar46._0_2_ = -(ushort)(-1 < local_3d8);
            auVar46._4_2_ = -(ushort)(-1 < sStack_3d4);
            auVar46._6_2_ = -(ushort)(-1 < vJHi16[1]);
            auVar46._8_2_ = -(ushort)(-1 < sStack_3d0);
            auVar46._10_2_ = -(ushort)(-1 < sStack_3ce);
            auVar46._12_2_ = -(ushort)(-1 < sStack_3cc);
            auVar46._14_2_ = -(ushort)(-1 < vJLo16[0]);
            auVar45._2_2_ = -(ushort)(-1 < sStack_3f6);
            auVar45._0_2_ = -(ushort)(-1 < local_3f8);
            auVar45._4_2_ = -(ushort)(-1 < sStack_3f4);
            auVar45._6_2_ = -(ushort)(-1 < (long)matrow0);
            auVar45._8_2_ = -(ushort)(-1 < sStack_3f0);
            auVar45._10_2_ = -(ushort)(-1 < sStack_3ee);
            auVar45._12_2_ = -(ushort)(-1 < sStack_3ec);
            auVar45._14_2_ = -(ushort)(-1 < vJHi16[0]);
            packsswb(auVar46,auVar45);
            auVar44._2_2_ = -(ushort)(sStack_3d6 < (short)gap_local);
            auVar44._0_2_ = -(ushort)(local_3d8 < (short)gap_local);
            auVar44._4_2_ = -(ushort)(sStack_3d4 < (short)gap_local);
            auVar44._6_2_ = -(ushort)(sStack_3d2 < (short)gap_local);
            auVar44._8_2_ = -(ushort)(sStack_3d0 < (short)gap_local);
            auVar44._10_2_ = -(ushort)(sStack_3ce < (short)gap_local);
            auVar44._12_2_ = -(ushort)(sStack_3cc < (short)gap_local);
            auVar44._14_2_ = -(ushort)(sStack_3ca < (short)gap_local);
            auVar43._2_2_ = -(ushort)(sStack_3f6 < (short)gap_local);
            auVar43._0_2_ = -(ushort)(local_3f8 < (short)gap_local);
            auVar43._4_2_ = -(ushort)(sStack_3f4 < (short)gap_local);
            auVar43._6_2_ = -(ushort)(sStack_3f2 < (short)gap_local);
            auVar43._8_2_ = -(ushort)(sStack_3f0 < (short)gap_local);
            auVar43._10_2_ = -(ushort)(sStack_3ee < (short)gap_local);
            auVar43._12_2_ = -(ushort)(sStack_3ec < (short)gap_local);
            auVar43._14_2_ = -(ushort)(sStack_3ea < (short)gap_local);
            packsswb(auVar44,auVar43);
            local_278 = (short)vEndJHi[1];
            sStack_276 = (short)((ulong)vEndJHi[1] >> 0x10);
            sStack_274 = (short)((ulong)vEndJHi[1] >> 0x20);
            sStack_272 = (short)((ulong)vEndJHi[1] >> 0x30);
            sStack_270 = (short)vEndJLo[0];
            sStack_26e = (short)((ulong)vEndJLo[0] >> 0x10);
            sStack_26c = (short)((ulong)vEndJLo[0] >> 0x20);
            sStack_26a = (short)((ulong)vEndJLo[0] >> 0x30);
            local_258 = (short)vILimit16[1];
            sStack_256 = (short)((ulong)vILimit16[1] >> 0x10);
            sStack_254 = (short)((ulong)vILimit16[1] >> 0x20);
            sStack_252 = (short)((ulong)vILimit16[1] >> 0x30);
            sStack_250 = (short)vEndJHi[0];
            sStack_24e = (short)((ulong)vEndJHi[0] >> 0x10);
            sStack_24c = (short)((ulong)vEndJHi[0] >> 0x20);
            sStack_24a = (short)((ulong)vEndJHi[0] >> 0x30);
            auVar42._2_2_ = -(ushort)(sStack_3d6 < sStack_276);
            auVar42._0_2_ = -(ushort)(local_3d8 < local_278);
            auVar42._4_2_ = -(ushort)(sStack_3d4 < sStack_274);
            auVar42._6_2_ = -(ushort)(sStack_3d2 < sStack_272);
            auVar42._8_2_ = -(ushort)(sStack_3d0 < sStack_270);
            auVar42._10_2_ = -(ushort)(sStack_3ce < sStack_26e);
            auVar42._12_2_ = -(ushort)(sStack_3cc < sStack_26c);
            auVar42._14_2_ = -(ushort)(sStack_3ca < sStack_26a);
            auVar41._2_2_ = -(ushort)(sStack_3f6 < sStack_256);
            auVar41._0_2_ = -(ushort)(local_3f8 < local_258);
            auVar41._4_2_ = -(ushort)(sStack_3f4 < sStack_254);
            auVar41._6_2_ = -(ushort)(sStack_3f2 < sStack_252);
            auVar41._8_2_ = -(ushort)(sStack_3f0 < sStack_250);
            auVar41._10_2_ = -(ushort)(sStack_3ee < sStack_24e);
            auVar41._12_2_ = -(ushort)(sStack_3ec < sStack_24c);
            auVar41._14_2_ = -(ushort)(sStack_3ea < sStack_24a);
            packsswb(auVar42,auVar41);
            a_08[1] = alVar75[1];
            a_08[0] = b_01[1];
            mask_01[1] = lVar72;
            mask_01[0] = lVar71;
            alVar76 = _mm_blendv_epi8_rpl(a_08,b_08,mask_01);
            b_09[0] = alVar76[1];
            a_09[1] = alVar75[1];
            a_09[0] = b_01[1];
            b_09[1] = b_08[1];
            mask_02[1] = lVar72;
            mask_02[0] = lVar71;
            vEndILo[1] = extraout_XMM0_Qa_05;
            alVar76 = _mm_blendv_epi8_rpl(a_09,b_09,mask_02);
            b_10[0] = alVar76[1];
            a_10[1] = alVar75[1];
            a_10[0] = b_01[1];
            b_10[1] = b_08[1];
            mask_03[1] = lVar72;
            mask_03[0] = lVar71;
            alVar76 = _mm_blendv_epi8_rpl(a_10,b_10,mask_03);
            b_11[0] = alVar76[1];
            a_11[1] = alVar75[1];
            a_11[0] = b_01[1];
            b_11[1] = b_08[1];
            mask_04[1] = lVar72;
            mask_04[0] = lVar71;
            alVar76 = _mm_blendv_epi8_rpl(a_11,b_11,mask_04);
            b_12[0] = alVar76[1];
            a_12[1] = alVar75[1];
            a_12[0] = b_01[1];
            b_12[1] = b_08[1];
            mask_05[1] = lVar72;
            mask_05[0] = lVar71;
            alVar76 = _mm_blendv_epi8_rpl(a_12,b_12,mask_05);
            b_13[0] = alVar76[1];
            a_13[1] = alVar75[1];
            a_13[0] = b_01[1];
            b_13[1] = b_08[1];
            mask_06[1] = lVar72;
            mask_06[0] = lVar71;
            alVar76 = _mm_blendv_epi8_rpl(a_13,b_13,mask_06);
            b_14[0] = alVar76[1];
            a_14[1] = alVar75[1];
            a_14[0] = b_01[1];
            b_14[1] = b_08[1];
            mask_07[1] = lVar72;
            mask_07[0] = lVar71;
            vEndIHi[1] = extraout_XMM0_Qa_06;
            vEndILo[0] = extraout_XMM0_Qb_05;
            alVar76 = _mm_blendv_epi8_rpl(a_14,b_14,mask_07);
            b_15[0] = alVar76[1];
            a_15[1] = alVar75[1];
            a_15[0] = b_01[1];
            b_15[1] = b_08[1];
            mask_08[1] = lVar72;
            mask_08[0] = lVar71;
            vEndJLo[1] = extraout_XMM0_Qa_07;
            vEndIHi[0] = extraout_XMM0_Qb_06;
            alVar76 = _mm_blendv_epi8_rpl(a_15,b_15,mask_08);
            b_16[0] = alVar76[1];
            a_16[1] = alVar75[1];
            a_16[0] = b_01[1];
            b_16[1] = b_08[1];
            mask_09[1] = lVar72;
            mask_09[0] = lVar71;
            vEndJHi[1] = extraout_XMM0_Qa_08;
            vEndJLo[0] = extraout_XMM0_Qb_07;
            alVar75 = _mm_blendv_epi8_rpl(a_16,b_16,mask_09);
            vJHi16[1] = CONCAT26(sStack_3d2 + 1,
                                 CONCAT24(sStack_3d4 + 1,CONCAT22(sStack_3d6 + 1,local_3d8 + 1)));
            vJLo16[0] = CONCAT26(sStack_3ca + 1,
                                 CONCAT24(sStack_3cc + 1,CONCAT22(sStack_3ce + 1,sStack_3d0 + 1)));
            matrow0 = (int *)CONCAT26(sStack_3f2 + 1,
                                      CONCAT24(sStack_3f4 + 1,CONCAT22(sStack_3f6 + 1,local_3f8 + 1)
                                              ));
            vJHi16[0] = CONCAT26(sStack_3ea + 1,
                                 CONCAT24(sStack_3ec + 1,CONCAT22(sStack_3ee + 1,sStack_3f0 + 1)));
            vF[1] = extraout_XMM0_Qa_02;
            vE[0] = extraout_XMM0_Qb_02;
            vILimit16[1] = extraout_XMM0_Qa_09;
            vEndJHi[0] = extraout_XMM0_Qb_08;
          }
          vIHi16[1] = CONCAT26(sStack_302 + 0x10,
                               CONCAT24(sStack_304 + 0x10,
                                        CONCAT22(sStack_306 + 0x10,local_308 + 0x10)));
          vILo16[0] = CONCAT26(sStack_2fa + 0x10,
                               CONCAT24(sStack_2fc + 0x10,
                                        CONCAT22(sStack_2fe + 0x10,sStack_300 + 0x10)));
          vJresetLo16[1] =
               CONCAT26(sStack_2e2 + 0x10,
                        CONCAT24(sStack_2e4 + 0x10,CONCAT22(sStack_2e6 + 0x10,local_2e8 + 0x10)));
          vIHi16[0] = CONCAT26(sStack_2da + 0x10,
                               CONCAT24(sStack_2dc + 0x10,
                                        CONCAT22(sStack_2de + 0x10,sStack_2e0 + 0x10)));
        }
        ilo = (int16_t *)(vEndILo + 1);
        jlo = (int16_t *)(vEndIHi + 1);
        ihi = (int16_t *)(vEndJHi + 1);
        jhi = (int16_t *)(vEndJLo + 1);
        plStack_bf0 = vILimit16 + 1;
        vNegLimit[1]._5_1_ = cVar68;
        for (local_bf4 = 0; local_bf4 < 8; local_bf4 = local_bf4 + 1) {
          if (vNegLimit[1]._5_1_ < (char)*ilo) {
            vNegLimit[1]._5_1_ = (char)*ilo;
            iStack_8ac = (int)*jlo;
            local_8b0 = (int)*ihi;
          }
          else if ((char)*ilo == vNegLimit[1]._5_1_) {
            if (*ihi < local_8b0) {
              iStack_8ac = (int)*jlo;
              local_8b0 = (int)*ihi;
            }
            else if ((*ihi == local_8b0) && (*jlo < iStack_8ac)) {
              iStack_8ac = (int)*jlo;
              local_8b0 = (int)*ihi;
            }
          }
          ilo = (int16_t *)((long)ilo + 1);
          jlo = jlo + 1;
          ihi = ihi + 1;
        }
        for (local_bf4 = 8; local_bf4 < 0x10; local_bf4 = local_bf4 + 1) {
          if (vNegLimit[1]._5_1_ < (char)*ilo) {
            vNegLimit[1]._5_1_ = (char)*ilo;
            iStack_8ac = (int)*jhi;
            local_8b0 = (int)(short)*plStack_bf0;
          }
          else if ((char)*ilo == vNegLimit[1]._5_1_) {
            if ((short)*plStack_bf0 < local_8b0) {
              iStack_8ac = (int)*jhi;
              local_8b0 = (int)(short)*plStack_bf0;
            }
            else if (((short)*plStack_bf0 == local_8b0) && (*jhi < iStack_8ac)) {
              iStack_8ac = (int)*jhi;
              local_8b0 = (int)(short)*plStack_bf0;
            }
          }
          ilo = (int16_t *)((long)ilo + 1);
          jhi = jhi + 1;
          plStack_bf0 = (longlong *)((long)plStack_bf0 + 2);
        }
        local_58 = (char)vSaturationCheckMax[1];
        cStack_57 = (char)((ulong)vSaturationCheckMax[1] >> 8);
        cStack_56 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
        cStack_55 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
        cStack_54 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
        cStack_53 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
        cStack_52 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
        cStack_51 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
        cStack_50 = (char)vSaturationCheckMin[0];
        cStack_4f = (char)((ulong)vSaturationCheckMin[0] >> 8);
        cStack_4e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
        cStack_4d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
        cStack_4c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
        cStack_4b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
        cStack_4a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
        cStack_49 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
        local_1d8 = (char)vNegInf[1];
        cStack_1d7 = (char)((ulong)vNegInf[1] >> 8);
        cStack_1d6 = (char)((ulong)vNegInf[1] >> 0x10);
        cStack_1d5 = (char)((ulong)vNegInf[1] >> 0x18);
        cStack_1d4 = (char)((ulong)vNegInf[1] >> 0x20);
        cStack_1d3 = (char)((ulong)vNegInf[1] >> 0x28);
        cStack_1d2 = (char)((ulong)vNegInf[1] >> 0x30);
        cStack_1d1 = (char)((ulong)vNegInf[1] >> 0x38);
        cStack_1d0 = (char)vSaturationCheckMax[0];
        cStack_1cf = (char)((ulong)vSaturationCheckMax[0] >> 8);
        cStack_1ce = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
        cStack_1cd = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
        cStack_1cc = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
        cStack_1cb = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
        cStack_1ca = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
        cStack_1c9 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
        uVar74 = CONCAT17(-(cStack_49 < cVar68),
                          CONCAT16(-(cStack_4a < cVar68),
                                   CONCAT15(-(cStack_4b < cVar68),
                                            CONCAT14(-(cStack_4c < cVar68),
                                                     CONCAT13(-(cStack_4d < cVar68),
                                                              CONCAT12(-(cStack_4e < cVar68),
                                                                       CONCAT11(-(cStack_4f < cVar68
                                                                                 ),-(cStack_50 <
                                                                                    cVar68)))))))) |
                 CONCAT17(-(cVar69 < cStack_1c9),
                          CONCAT16(-(cVar69 < cStack_1ca),
                                   CONCAT15(-(cVar69 < cStack_1cb),
                                            CONCAT14(-(cVar69 < cStack_1cc),
                                                     CONCAT13(-(cVar69 < cStack_1cd),
                                                              CONCAT12(-(cVar69 < cStack_1ce),
                                                                       CONCAT11(-(cVar69 < 
                                                  cStack_1cf),-(cVar69 < cStack_1d0))))))));
        auVar66._8_8_ = uVar74;
        auVar66._0_8_ =
             CONCAT17(-(cStack_51 < cVar68),
                      CONCAT16(-(cStack_52 < cVar68),
                               CONCAT15(-(cStack_53 < cVar68),
                                        CONCAT14(-(cStack_54 < cVar68),
                                                 CONCAT13(-(cStack_55 < cVar68),
                                                          CONCAT12(-(cStack_56 < cVar68),
                                                                   CONCAT11(-(cStack_57 < cVar68),
                                                                            -(local_58 < cVar68)))))
                                       ))) |
             CONCAT17(-(cVar69 < cStack_1d1),
                      CONCAT16(-(cVar69 < cStack_1d2),
                               CONCAT15(-(cVar69 < cStack_1d3),
                                        CONCAT14(-(cVar69 < cStack_1d4),
                                                 CONCAT13(-(cVar69 < cStack_1d5),
                                                          CONCAT12(-(cVar69 < cStack_1d6),
                                                                   CONCAT11(-(cVar69 < cStack_1d7),
                                                                            -(cVar69 < local_1d8))))
                                                ))));
        if ((((((((((((((((auVar66 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar66 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar66 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar66 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar66 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar66 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar74 >> 7 & 1) != 0) || (uVar74 >> 0xf & 1) != 0) || (uVar74 >> 0x17 & 1) != 0)
               || (uVar74 >> 0x1f & 1) != 0) || (uVar74 >> 0x27 & 1) != 0) ||
             (uVar74 >> 0x2f & 1) != 0) || (uVar74 >> 0x37 & 1) != 0) || (long)uVar74 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          vNegLimit[1]._5_1_ = '\0';
          iStack_8ac = 0;
          local_8b0 = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)vNegLimit[1]._5_1_;
        ((parasail_result_t *)_s1_local)->end_query = iStack_8ac;
        ((parasail_result_t *)_s1_local)->end_ref = local_8b0;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int8_t * restrict s1 = NULL;
    int8_t * restrict s2B = NULL;
    int8_t * restrict _H_pr = NULL;
    int8_t * restrict _F_pr = NULL;
    int8_t * restrict s2 = NULL;
    int8_t * restrict H_pr = NULL;
    int8_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne16;
    __m128i vNegOne16;
    __m128i vN16;
    __m128i vILo16;
    __m128i vIHi16;
    __m128i vJresetLo16;
    __m128i vJresetHi16;
    __m128i vMaxH;
    __m128i vEndILo;
    __m128i vEndIHi;
    __m128i vEndJLo;
    __m128i vEndJHi;
    __m128i vILimit16;
    __m128i vJLimit16;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi8(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 1); /* shift in a 0 */
    vOpen = _mm_set1_epi8(open);
    vGap  = _mm_set1_epi8(gap);
    vZero = _mm_set1_epi8(0);
    vOne16 = _mm_set1_epi16(1);
    vNegOne16 = _mm_set1_epi16(-1);
    vN16 = _mm_set1_epi16(N);
    vILo16 = _mm_set_epi16(8,9,10,11,12,13,14,15);
    vIHi16 = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJresetLo16 = _mm_set_epi16(-8,-9,-10,-11,-12,-13,-14,-15);
    vJresetHi16 = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndILo = vNegInf;
    vEndIHi = vNegInf;
    vEndJLo = vNegInf;
    vEndJHi = vNegInf;
    vILimit16 = _mm_set1_epi16(s1Len);
    vJLimit16 = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int8_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int8_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int8_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int8_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJLo16 = vJresetLo16;
        __m128i vJHi16 = vJresetHi16;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m128i vIltLimit = _mm_packs_epi16(
                    _mm_cmplt_epi16(vILo16, vILimit16),
                    _mm_cmplt_epi16(vIHi16, vILimit16));
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 1);
            vNH = _mm_insert_epi8_rpl(vNH, H_pr[j], 15);
            vF = _mm_srli_si128(vF, 1);
            vF = _mm_insert_epi8_rpl(vF, F_pr[j], 15);
            vF = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vNH, vOpen),
                    _mm_subs_epi8(vF, vGap));
            vE = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vWH, vOpen),
                    _mm_subs_epi8(vE, vGap));
            vMat = _mm_set_epi8(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm_adds_epi8(vNWH, vMat);
            vWH = _mm_max_epi8_rpl(vNWH, vE);
            vWH = _mm_max_epi8_rpl(vWH, vF);
            vWH = _mm_max_epi8_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_packs_epi16(
                        _mm_cmpeq_epi16(vJLo16,vNegOne16),
                        _mm_cmpeq_epi16(vJHi16,vNegOne16));
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int8_t)_mm_extract_epi8_rpl(vWH,0);
            F_pr[j-15] = (int8_t)_mm_extract_epi8_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_packs_epi16(
                            _mm_cmpgt_epi16(vJLo16, vNegOne16),
                            _mm_cmpgt_epi16(vJHi16, vNegOne16)),
                        _mm_packs_epi16(
                            _mm_cmplt_epi16(vJLo16, vJLimit16),
                            _mm_cmplt_epi16(vJHi16, vJLimit16)));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi8(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi8(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_packs_epi16(
                        _mm_cmplt_epi16(vJLo16, vEndJLo),
                        _mm_cmplt_epi16(vJHi16, vEndJHi));
                __m128i cond_lo = _mm_unpacklo_epi8(cond_all, cond_all);
                __m128i cond_hi = _mm_unpackhi_epi8(cond_all, cond_all);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndILo = _mm_blendv_epi8_rpl(vEndILo, vILo16, cond_lo);
                vEndIHi = _mm_blendv_epi8_rpl(vEndIHi, vIHi16, cond_hi);
                vEndJLo = _mm_blendv_epi8_rpl(vEndJLo, vJLo16, cond_lo);
                vEndJHi = _mm_blendv_epi8_rpl(vEndJHi, vJHi16, cond_hi);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                cond_lo = _mm_unpacklo_epi8(cond_all, cond_all);
                cond_hi = _mm_unpackhi_epi8(cond_all, cond_all);
                vEndILo = _mm_blendv_epi8_rpl(vEndILo, vILo16, cond_lo);
                vEndIHi = _mm_blendv_epi8_rpl(vEndIHi, vIHi16, cond_hi);
                vEndJLo = _mm_blendv_epi8_rpl(vEndJLo, vJLo16, cond_lo);
                vEndJHi = _mm_blendv_epi8_rpl(vEndJHi, vJHi16, cond_hi);
            }
            vJLo16 = _mm_add_epi16(vJLo16, vOne16);
            vJHi16 = _mm_add_epi16(vJHi16, vOne16);
        }
        vILo16 = _mm_add_epi16(vILo16, vN16);
        vIHi16 = _mm_add_epi16(vIHi16, vN16);
    }

    /* alignment ending position */
    {
        int8_t *t = (int8_t*)&vMaxH;
        int16_t *ilo = (int16_t*)&vEndILo;
        int16_t *jlo = (int16_t*)&vEndJLo;
        int16_t *ihi = (int16_t*)&vEndIHi;
        int16_t *jhi = (int16_t*)&vEndJHi;
        int32_t k;
        for (k=0; k<N/2; ++k, ++t, ++ilo, ++jlo) {
            if (*t > score) {
                score = *t;
                end_query = *ilo;
                end_ref = *jlo;
            }
            else if (*t == score) {
                if (*jlo < end_ref) {
                    end_query = *ilo;
                    end_ref = *jlo;
                }
                else if (*jlo == end_ref && *ilo < end_query) {
                    end_query = *ilo;
                    end_ref = *jlo;
                }
            }
        }
        for (k=N/2; k<N; ++k, ++t, ++ihi, ++jhi) {
            if (*t > score) {
                score = *t;
                end_query = *ihi;
                end_ref = *jhi;
            }
            else if (*t == score) {
                if (*jhi < end_ref) {
                    end_query = *ihi;
                    end_ref = *jhi;
                }
                else if (*jhi == end_ref && *ihi < end_query) {
                    end_query = *ihi;
                    end_ref = *jhi;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}